

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

VkDescriptorSet
Diligent::AllocateDescriptorSet
          (VulkanLogicalDevice *LogicalDevice,VkDescriptorPool Pool,VkDescriptorSetLayout SetLayout,
          char *DebugName)

{
  VkDescriptorSet pVVar1;
  undefined1 local_50 [8];
  VkDescriptorSetAllocateInfo DescrSetAllocInfo;
  char *DebugName_local;
  VkDescriptorSetLayout SetLayout_local;
  VkDescriptorPool Pool_local;
  VulkanLogicalDevice *LogicalDevice_local;
  
  DescrSetAllocInfo.pSetLayouts = (VkDescriptorSetLayout *)DebugName;
  DebugName_local = (char *)SetLayout;
  SetLayout_local = (VkDescriptorSetLayout)Pool;
  Pool_local = (VkDescriptorPool)LogicalDevice;
  memset(local_50,0,0x28);
  local_50._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  DescrSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  DescrSetAllocInfo._4_4_ = 0;
  DescrSetAllocInfo.pNext = SetLayout_local;
  DescrSetAllocInfo.descriptorPool._0_4_ = 1;
  DescrSetAllocInfo._24_8_ = &DebugName_local;
  pVVar1 = VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
                     ((VulkanLogicalDevice *)Pool_local,(VkDescriptorSetAllocateInfo *)local_50,
                      (char *)DescrSetAllocInfo.pSetLayouts);
  return pVVar1;
}

Assistant:

static VkDescriptorSet AllocateDescriptorSet(const VulkanUtilities::VulkanLogicalDevice& LogicalDevice,
                                             VkDescriptorPool                            Pool,
                                             VkDescriptorSetLayout                       SetLayout,
                                             const char*                                 DebugName)
{
    VkDescriptorSetAllocateInfo DescrSetAllocInfo = {};

    DescrSetAllocInfo.sType              = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    DescrSetAllocInfo.pNext              = nullptr;
    DescrSetAllocInfo.descriptorPool     = Pool;
    DescrSetAllocInfo.descriptorSetCount = 1;
    DescrSetAllocInfo.pSetLayouts        = &SetLayout;
    // Descriptor pools are externally synchronized, meaning that the application must not allocate
    // and/or free descriptor sets from the same pool in multiple threads simultaneously (13.2.3)
    return LogicalDevice.AllocateVkDescriptorSet(DescrSetAllocInfo, DebugName);
}